

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

char * get_absolute_path(char *path,econf_err *error)

{
  char *local_28;
  char *absolute_path;
  econf_err *error_local;
  char *path_local;
  
  if (*path == '/') {
    local_28 = strdup(path);
  }
  else {
    local_28 = realpath(path,(char *)0x0);
    if (local_28 == (char *)0x0) {
      if (error != (econf_err *)0x0) {
        *error = ECONF_NOFILE;
      }
      return (char *)0x0;
    }
  }
  if ((local_28 == (char *)0x0) && (error != (econf_err *)0x0)) {
    *error = ECONF_NOMEM;
  }
  return local_28;
}

Assistant:

char *get_absolute_path(const char *path, econf_err *error) {
  char *absolute_path;
  if(*path != '/') {
    absolute_path = realpath(path, NULL);
    if(absolute_path == NULL) {
      if (error)
	*error = ECONF_NOFILE;
      return NULL;
    }
  } else {
    absolute_path = strdup(path);
  }
  if (absolute_path == NULL && error)
    *error = ECONF_NOMEM;

  return absolute_path;
}